

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_nemotron::llm_build_nemotron
          (llm_build_nemotron *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  ggml_tensor *pgVar3;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  pointer plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int il;
  long lVar10;
  long lVar11;
  ggml_tensor *inpSA;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar12;
  ggml_tensor *local_60;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 != plVar2->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2b68,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_60 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar3 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      il = (int)lVar10;
      pgVar4 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_60,
                          *(ggml_tensor **)((long)&plVar7->attn_norm + lVar11),
                          *(ggml_tensor **)((long)&plVar7->attn_norm_b + lVar11),LLM_NORM,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"attn_norm",il);
      pgVar5 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wq + lVar11),pgVar4);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (*(long *)((long)&plVar7->bq + lVar11) != 0) {
        pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il);
        plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      pgVar6 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)((long)&plVar7->wk + lVar11),pgVar4);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (*(long *)((long)&plVar7->bk + lVar11) != 0) {
        pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il);
        plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      pgVar4 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)((long)&plVar7->wv + lVar11),pgVar4);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il);
      if (*(long *)((long)&((model->layers).
                            super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                            super__Vector_impl_data._M_start)->bv + lVar11) != 0) {
        pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar4);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il);
      }
      uVar8 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar5,uVar1,
                              (this->super_llm_graph_context).n_head,
                              (long)(this->super_llm_graph_context).n_tokens);
      uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                              (this->super_llm_graph_context).n_head_kv,
                              (long)(this->super_llm_graph_context).n_tokens);
      pgVar4 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar4,uVar1,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar5 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar8,pgVar3,0,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             CONCAT44(uVar12,(this->super_llm_graph_context).n_ctx_orig));
      pgVar6 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar9,pgVar3,0,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar4 = llm_graph_context::build_attn
                         (&this->super_llm_graph_context,inp,gf,
                          *(ggml_tensor **)((long)&plVar7->wo + lVar11),
                          *(ggml_tensor **)((long)&plVar7->bo + lVar11),pgVar5,pgVar6,pgVar4,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / SQRT((float)uVar1),il);
      if (lVar10 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar5 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar4 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar4,pgVar5);
        local_60 = (ggml_tensor *)
                   ggml_get_rows((this->super_llm_graph_context).ctx0,local_60,pgVar5);
      }
      pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar4,local_60);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"ffn_inp",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar5 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar4,
                          *(ggml_tensor **)((long)&plVar7->ffn_norm + lVar11),
                          *(ggml_tensor **)((long)&plVar7->ffn_norm_b + lVar11),LLM_NORM,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_norm",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff48 = 0;
      pgVar5 = llm_graph_context::build_ffn
                         (&this->super_llm_graph_context,pgVar5,
                          *(ggml_tensor **)((long)&plVar7->ffn_up + lVar11),
                          *(ggml_tensor **)((long)&plVar7->ffn_up_b + lVar11),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                          *(ggml_tensor **)((long)&plVar7->ffn_down + lVar11),
                          *(ggml_tensor **)((long)&plVar7->ffn_down_b + lVar11),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,LLM_FFN_RELU_SQR,LLM_FFN_SEQ,il);
      pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,pgVar4);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"ffn_out",il);
      local_60 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar4,il);
      llm_graph_context::cb(&this->super_llm_graph_context,local_60,"l_out",il);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x4f0;
    } while (lVar10 < (this->super_llm_graph_context).n_layer);
  }
  pgVar3 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_60,model->output_norm,
                      model->output_norm_b,LLM_NORM,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar3;
  pgVar3 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar3);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar3;
  ggml_build_forward_expand(gf,pgVar3);
  return;
}

Assistant:

llm_build_nemotron(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        //GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm,
                    model.layers[il].ffn_norm_b,
                    LLM_NORM, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                    NULL,                      NULL,                        NULL,
                    model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                    NULL,
                    LLM_FFN_RELU_SQR, LLM_FFN_SEQ, il);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }